

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLVMSlicer.h
# Opt level: O2

LLVMBBlock * dg::llvmdg::LLVMSlicer::createNewExitBB(LLVMDependenceGraph *graph)

{
  LLVMContext *Context;
  long lVar1;
  bool bVar2;
  BBlock<dg::LLVMNode> *this;
  BasicBlock *val;
  Value *pVVar3;
  IntegerType *pIVar4;
  LLVMNode *this_00;
  StringRef RHS;
  Child local_50 [2];
  undefined2 local_30;
  
  this = (BBlock<dg::LLVMNode> *)operator_new(0x208);
  BBlock<dg::LLVMNode>::BBlock(this,(LLVMNode *)0x0,(DependenceGraphT *)0x0);
  Context = (LLVMContext *)**(undefined8 **)(graph + 0x140);
  local_50[0].twine = "safe_return";
  local_30 = 0x103;
  val = llvm::BasicBlock::Create
                  (Context,(Twine *)&local_50[0].ptrAndLength,(Function *)0x0,(BasicBlock *)0x0);
  lVar1 = **(long **)(graph + 0x18);
  llvm::
  iplist_impl<llvm::simple_ilist<llvm::BasicBlock>,_llvm::SymbolTableListTraits<llvm::BasicBlock>_>
  ::push_back((iplist_impl<llvm::simple_ilist<llvm::BasicBlock>,_llvm::SymbolTableListTraits<llvm::BasicBlock>_>
               *)(lVar1 + 0x48),val);
  if (*(char *)(**(long **)(*(long *)(lVar1 + 0x18) + 0x10) + 8) == '\a') {
    pVVar3 = (Value *)llvm::ReturnInst::Create(Context,val);
  }
  else {
    local_50[0] = (Child)llvm::Value::getName();
    RHS.Length = 4;
    RHS.Data = "main";
    bVar2 = llvm::StringRef::equals((StringRef *)&local_50[0].ptrAndLength,RHS);
    if (bVar2) {
      pIVar4 = (IntegerType *)llvm::Type::getInt32Ty(Context);
      pVVar3 = (Value *)llvm::ConstantInt::get(pIVar4,0,false);
    }
    else {
      pVVar3 = (Value *)llvm::UndefValue::get
                                  ((Type *)**(undefined8 **)(*(long *)(lVar1 + 0x18) + 0x10));
    }
    pVVar3 = (Value *)llvm::ReturnInst::Create(Context,pVVar3,val);
  }
  this_00 = (LLVMNode *)operator_new(0x1f0);
  LLVMNode::LLVMNode(this_00,pVVar3,false);
  DependenceGraph<dg::LLVMNode>::addNode((DependenceGraph<dg::LLVMNode> *)graph,this_00);
  BBlock<dg::LLVMNode>::append(this,this_00);
  this->key = (KeyT)val;
  this->dg = graph;
  return this;
}

Assistant:

static LLVMBBlock *createNewExitBB(LLVMDependenceGraph *graph) {
        using namespace llvm;

        LLVMBBlock *exitBB = new LLVMBBlock();

        Module *M = graph->getModule();
        LLVMContext &Ctx = M->getContext();
        BasicBlock *block = BasicBlock::Create(Ctx, "safe_return");

        Value *fval = graph->getEntry()->getKey();
        Function *F = cast<Function>(fval);
        F->getBasicBlockList().push_back(block);

        // fill in basic block just with return value
        ReturnInst *RI;
        if (F->getReturnType()->isVoidTy())
            RI = ReturnInst::Create(Ctx, block);
        else if (F->getName().equals("main"))
            // if this is main, than the safe exit equals to returning 0
            // (it is just for convenience, we wouldn't need to do this)
            RI = ReturnInst::Create(
                    Ctx, ConstantInt::get(Type::getInt32Ty(Ctx), 0), block);
        else
            RI = ReturnInst::Create(Ctx, UndefValue::get(F->getReturnType()),
                                    block);

        LLVMNode *newRet = new LLVMNode(RI);
        graph->addNode(newRet);

        exitBB->append(newRet);
        exitBB->setKey(block);
        exitBB->setDG(graph);

        return exitBB;
    }